

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall
Rml::Context::GenerateKeyModifierEventParameters
          (Context *this,Dictionary *parameters,int key_modifier_state)

{
  int iVar1;
  type this_00;
  String *k;
  int i;
  long lVar2;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  uint local_2c;
  
  if (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                                 ::property_names_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                 ::property_names_abi_cxx11_,"ctrl_key",&local_2d);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 1),"shift_key",&local_2e);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 2),"alt_key",&local_2f);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 3),"meta_key",&local_30);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 4),"caps_lock_key",&local_31);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 5),"num_lock_key",&local_32);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 6),"scroll_lock_key",&local_33);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                           ::property_names_abi_cxx11_);
    }
  }
  k = GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_;
  for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
    local_2c = (uint)(((uint)key_modifier_state >> ((uint)lVar2 & 0x1f) & 1) != 0);
    this_00 = itlib::
              flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
              ::operator[]<std::__cxx11::string_const&>
                        ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                          *)parameters,k);
    Variant::operator=(this_00,(int *)&local_2c);
    k = k + 1;
  }
  return;
}

Assistant:

void Context::GenerateKeyModifierEventParameters(Dictionary& parameters, int key_modifier_state)
{
	static const String property_names[] = {"ctrl_key", "shift_key", "alt_key", "meta_key", "caps_lock_key", "num_lock_key", "scroll_lock_key"};

	for (int i = 0; i < 7; i++)
		parameters[property_names[i]] = (int)((key_modifier_state & (1 << i)) > 0);
}